

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeMemberAccess(ExpressionContext *ctx,SynMemberAccess *syntax)

{
  TypeBase *pTVar1;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  undefined4 extraout_var_00;
  ExprBase *pEVar4;
  
  pTVar3 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (pTVar3 == (TypeBase *)0x0) {
    pTVar3 = AnalyzeType(ctx,syntax->value,false,(bool *)0x0);
    if ((pTVar3 != (TypeBase *)0x0) &&
       (pEVar5 = CreateTypeidMemberAccess(ctx,&syntax->super_SynBase,pTVar3,syntax->member),
       pEVar5 != (ExprBase *)0x0)) {
      return pEVar5;
    }
    pEVar5 = AnalyzeExpression(ctx,syntax->value);
    if ((pEVar5->type == (TypeBase *)0x0) || (pEVar5->type->typeID != 0)) {
      pEVar5 = CreateMemberAccess(ctx,&syntax->super_SynBase,pEVar5,syntax->member,false);
      return pEVar5;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
    pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar4->typeID = 0x1a;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar3;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223c88;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pEVar5;
    *(undefined8 *)&pEVar4[1].typeID = 0;
  }
  else {
    if (pTVar3 == ctx->typeAuto) {
      anon_unknown.dwarf_9c70f::Stop
                (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeTypeID;
    pEVar4->typeID = 8;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar1;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223580;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pTVar3;
  }
  return pEVar4;
}

Assistant:

ExprBase* AnalyzeMemberAccess(ExpressionContext &ctx, SynMemberAccess *syntax)
{
	// It could be a typeid
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
	{
		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);
	}

	// It could be a type property
	if(TypeBase *type = AnalyzeType(ctx, syntax->value, false))
	{
		if(ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, type, syntax->member))
			return result;
	}

	ExprBase* value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(syntax, ctx.GetErrorType(), value, NULL);

	return CreateMemberAccess(ctx, syntax, value, syntax->member, false);
}